

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void ZSTDMT_compressionJob(void *jobDescription)

{
  pthread_cond_t *__cond;
  ldmState_t *ldmState;
  uint uVar1;
  BYTE *pBVar2;
  ZSTD_customMem customMem;
  uint uVar3;
  int iVar4;
  int iVar5;
  ZSTD_CCtx *cctx;
  unsigned_long_long *puVar7;
  size_t sVar8;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  void *pvVar13;
  void *dst;
  long lVar14;
  char cVar15;
  bool bVar16;
  buffer_t bVar17;
  buffer_t buf;
  ZSTD_CCtx_params jobParams;
  void *local_190;
  undefined8 in_stack_fffffffffffffe80;
  pthread_mutex_t *ppVar18;
  pthread_mutex_t *ppVar19;
  undefined8 in_stack_fffffffffffffe88;
  BYTE *src;
  void *in_stack_fffffffffffffe90;
  ulong local_160;
  rawSeqStore_t local_128;
  ZSTD_CCtx_params local_100;
  rawSeq *prVar6;
  
  memcpy(&local_100,(void *)((long)jobDescription + 200),0xd0);
  ppVar18 = *(pthread_mutex_t **)((long)jobDescription + 0x68);
  pthread_mutex_lock(ppVar18);
  iVar5 = *(int *)((long)ppVar18 + 0x2c);
  if ((long)iVar5 == 0) {
    pthread_mutex_unlock(ppVar18);
    customMem.customFree = (ZSTD_freeFunction)in_stack_fffffffffffffe88;
    customMem.customAlloc = (ZSTD_allocFunction)in_stack_fffffffffffffe80;
    customMem.opaque = in_stack_fffffffffffffe90;
    cctx = ZSTD_createCCtx_advanced(customMem);
    uVar9 = extraout_RDX_00;
  }
  else {
    *(int *)((long)ppVar18 + 0x2c) = iVar5 + -1;
    cctx = *(ZSTD_CCtx **)((long)ppVar18 + (long)iVar5 * 8 + 0x40);
    pthread_mutex_unlock(ppVar18);
    uVar9 = extraout_RDX;
  }
  if ((*(ZSTDMT_bufferPool **)((long)jobDescription + 0x78))->bufferSize == 0) {
    prVar6 = (rawSeq *)0x0;
    local_160 = 0;
  }
  else {
    bVar17 = ZSTDMT_getBuffer(*(ZSTDMT_bufferPool **)((long)jobDescription + 0x78));
    prVar6 = (rawSeq *)bVar17.start;
    uVar9 = bVar17.capacity / 0xc;
    local_160 = uVar9;
  }
  uVar12 = 0xffffffffffffffc0;
  if (cctx == (ZSTD_CCtx *)0x0) {
LAB_001c0902:
    pthread_mutex_lock((pthread_mutex_t *)((long)jobDescription + 0x10));
    *(ulong *)((long)jobDescription + 8) = uVar12;
    pthread_mutex_unlock((pthread_mutex_t *)((long)jobDescription + 0x10));
  }
  else {
    bVar17.capacity = uVar9;
    bVar17.start = *(void **)((long)jobDescription + 0x88);
    if (*(void **)((long)jobDescription + 0x88) == (void *)0x0) {
      bVar17 = ZSTDMT_getBuffer(*(ZSTDMT_bufferPool **)((long)jobDescription + 0x70));
      local_190 = (void *)bVar17.capacity;
      if (bVar17.start == (void *)0x0) goto LAB_001c0902;
      *(buffer_t *)((long)jobDescription + 0x88) = bVar17;
    }
    else {
      local_190 = *(void **)((long)jobDescription + 0x90);
    }
    dst = bVar17.start;
    if ((local_100.ldmParams.enableLdm == ZSTD_ps_enable) && (prVar6 == (rawSeq *)0x0))
    goto LAB_001c0902;
    if (*(int *)((long)jobDescription + 0xb8) != 0) {
      local_100.fParams.checksumFlag = 0;
    }
    local_100.ldmParams.enableLdm = ZSTD_ps_disable;
    local_100.nbWorkers = 0;
    if (*(ZSTD_CDict **)((long)jobDescription + 0x198) == (ZSTD_CDict *)0x0) {
      bVar16 = *(int *)((long)jobDescription + 0xbc) == 0;
      puVar7 = (unsigned_long_long *)((long)jobDescription + 0x1a0);
      if (bVar16) {
        puVar7 = (unsigned_long_long *)((long)jobDescription + 0xb0);
      }
      local_100.forceWindow = (int)bVar16;
      if (*(int *)((long)jobDescription + 0xbc) == 0) {
        local_100.deterministicRefPrefix = 0;
      }
      uVar12 = ZSTD_compressBegin_advanced_internal
                         (cctx,*(void **)((long)jobDescription + 0x98),
                          *(size_t *)((long)jobDescription + 0xa0),ZSTD_dct_rawContent,
                          ZSTD_dtlm_fast,(ZSTD_CDict *)0x0,&local_100,*puVar7);
    }
    else {
      uVar12 = ZSTD_compressBegin_advanced_internal
                         (cctx,(void *)0x0,0,ZSTD_dct_auto,ZSTD_dtlm_fast,
                          *(ZSTD_CDict **)((long)jobDescription + 0x198),&local_100,
                          *(unsigned_long_long *)((long)jobDescription + 0x1a0));
      if (*(int *)((long)jobDescription + 0xbc) == 0) {
        __assert_fail("job->firstJob",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x87a3,"void ZSTDMT_compressionJob(void *)");
      }
    }
    if (0xffffffffffffff88 < uVar12) goto LAB_001c0902;
    ppVar18 = *(pthread_mutex_t **)((long)jobDescription + 0x80);
    src = *(BYTE **)((long)jobDescription + 0xa8);
    uVar1 = *(uint *)((long)jobDescription + 0xb8);
    uVar9 = *(ulong *)((long)jobDescription + 0xb0);
    local_128.pos = 0;
    local_128.posInSequence = 0;
    local_128.size = 0;
    local_128.capacity = local_160;
    local_128.seq = prVar6;
    pthread_mutex_lock(ppVar18);
    uVar3 = *(uint *)((long)ppVar18 + 0x9c0);
    if (uVar3 < uVar1) {
      do {
        pthread_cond_wait((pthread_cond_t *)(ppVar18 + 1),ppVar18);
        uVar3 = *(uint *)((long)ppVar18 + 0x9c0);
      } while (uVar3 < uVar1);
    }
    if (uVar3 == uVar1) {
      if (*(int *)((long)ppVar18 + 0xb8) == 1) {
        if ((((prVar6 == (rawSeq *)0x0) || (local_128.pos != 0)) || (local_128.size != 0)) ||
           (local_160 == 0)) {
          __assert_fail("seqStore.seq != NULL && seqStore.pos == 0 && seqStore.size == 0 && seqStore.capacity > 0"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x872a,
                        "void ZSTDMT_serialState_update(serialState_t *, ZSTD_CCtx *, rawSeqStore_t, range_t, unsigned int)"
                       );
        }
        if (*(ulong *)((long)ppVar18 + 0xa8) < uVar9) {
          __assert_fail("src.size <= serialState->params.jobSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x872b,
                        "void ZSTDMT_serialState_update(serialState_t *, ZSTD_CCtx *, rawSeqStore_t, range_t, unsigned int)"
                       );
        }
        ldmState = (ldmState_t *)((long)ppVar18 + 0x128);
        if (uVar9 != 0) {
          lVar11 = *(long *)((long)ppVar18 + 0x130);
          if (lVar11 == 0) {
            __assert_fail("window->base != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x48d8,
                          "U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)");
          }
          if (*(long *)((long)ppVar18 + 0x138) == 0) {
            __assert_fail("window->dictBase != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x48d9,
                          "U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)");
          }
          pBVar2 = (ldmState->window).nextSrc;
          if (pBVar2 != src) {
            uVar12 = (long)pBVar2 - lVar11;
            iVar5 = ppVar18[8].__data.__lock;
            *(int *)((long)ppVar18 + 0x144) = iVar5;
            if (uVar12 >> 0x20 != 0) {
              __assert_fail("distanceFromBase == (size_t)(U32)distanceFromBase",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x48e0,
                            "U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)");
            }
            iVar4 = (int)uVar12;
            ppVar18[8].__data.__lock = iVar4;
            *(long *)((long)ppVar18 + 0x138) = lVar11;
            *(ulong *)((long)ppVar18 + 0x130) = (long)src - uVar12;
            if ((uint)(iVar4 - iVar5) < 8) {
              *(int *)((long)ppVar18 + 0x144) = iVar4;
            }
          }
          pBVar2 = src + uVar9;
          *(BYTE **)((long)ppVar18 + 0x128) = pBVar2;
          lVar11 = *(long *)((long)ppVar18 + 0x138);
          uVar1 = ppVar18[8].__data.__lock;
          if (src < (BYTE *)(lVar11 + (ulong)uVar1) &&
              (BYTE *)((ulong)*(uint *)((long)ppVar18 + 0x144) + lVar11) < pBVar2) {
            uVar3 = (uint)((long)pBVar2 - lVar11);
            if ((long)(ulong)uVar1 < (long)pBVar2 - lVar11) {
              uVar3 = uVar1;
            }
            *(uint *)((long)ppVar18 + 0x144) = uVar3;
          }
        }
        sVar8 = ZSTD_ldm_generateSequences
                          (ldmState,&local_128,(ldmParams_t *)((long)ppVar18 + 0xb8),src,uVar9);
        if (0xffffffffffffff88 < sVar8) {
          __assert_fail("!ZSTD_isError(error)",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x8731,
                        "void ZSTDMT_serialState_update(serialState_t *, ZSTD_CCtx *, rawSeqStore_t, range_t, unsigned int)"
                       );
        }
        pthread_mutex_lock((pthread_mutex_t *)((long)ppVar18 + 0x9c8));
        *(BYTE **)((long)ppVar18 + 0xa20) = (ldmState->window).nextSrc;
        ppVar18[0x41].__align = *(long *)((long)ppVar18 + 0x130);
        *(undefined8 *)((long)ppVar18 + 0xa30) = *(undefined8 *)((long)ppVar18 + 0x138);
        *(long *)((long)ppVar18 + 0xa38) = ppVar18[8].__align;
        *(undefined8 *)((long)ppVar18 + 0xa40) = *(undefined8 *)((long)ppVar18 + 0x148);
        pthread_cond_signal((pthread_cond_t *)((long)ppVar18 + 0x9f0));
        pthread_mutex_unlock((pthread_mutex_t *)((long)ppVar18 + 0x9c8));
      }
      if (uVar9 != 0 && *(int *)((long)ppVar18 + 0x7c) != 0) {
        XXH_INLINE_XXH64_update((XXH_NAMESPACEXXH64_state_t *)((long)ppVar18 + 0x968),src,uVar9);
      }
    }
    *(int *)((long)ppVar18 + 0x9c0) = *(int *)((long)ppVar18 + 0x9c0) + 1;
    pthread_cond_broadcast((pthread_cond_t *)(ppVar18 + 1));
    pthread_mutex_unlock(ppVar18);
    if (local_128.size != 0) {
      if ((cctx->stage == ZSTDcs_init) &&
         ((cctx->appliedParams).ldmParams.enableLdm != ZSTD_ps_enable)) {
        (cctx->externSeqStore).seq = local_128.seq;
        (cctx->externSeqStore).size = local_128.size;
        (cctx->externSeqStore).capacity = local_128.size;
        (cctx->externSeqStore).pos = 0;
        (cctx->externSeqStore).posInSequence = 0;
        bVar16 = true;
      }
      else {
        bVar16 = false;
      }
      if (*(int *)((long)ppVar18 + 0xb8) != 1) {
        __assert_fail("serialState->params.ldmParams.enableLdm == ZSTD_ps_enable",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8745,
                      "void ZSTDMT_serialState_update(serialState_t *, ZSTD_CCtx *, rawSeqStore_t, range_t, unsigned int)"
                     );
      }
      if (!bVar16) {
        __assert_fail("!ZSTD_isError(err)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8746,
                      "void ZSTDMT_serialState_update(serialState_t *, ZSTD_CCtx *, rawSeqStore_t, range_t, unsigned int)"
                     );
      }
    }
    if (*(int *)((long)jobDescription + 0xbc) != 0) {
LAB_001c0b1c:
      if (0x7ffffffe < *(ulong *)((long)jobDescription + 0xb0) >> 0x13) {
        __assert_fail("job->src.size < ((size_t)INT_MAX) * chunkSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x87c8,"void ZSTDMT_compressionJob(void *)");
      }
      if (*(long *)((long)jobDescription + 8) != 0) {
        __assert_fail("job->cSize == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x87ca,"void ZSTDMT_compressionJob(void *)");
      }
      uVar9 = *(ulong *)((long)jobDescription + 0xb0) + 0x7ffff >> 0x13;
      pvVar13 = (void *)((long)local_190 + (long)dst);
      local_190 = *(void **)((long)jobDescription + 0xa8);
      iVar5 = (int)uVar9;
      if (1 < iVar5) {
        __cond = (pthread_cond_t *)((long)jobDescription + 0x38);
        lVar14 = uVar9 - 1;
        lVar11 = 0x80000;
        ppVar18 = (pthread_mutex_t *)((long)jobDescription + 0x10);
        do {
          sVar8 = ZSTD_compressContinue_internal
                            (cctx,dst,(long)pvVar13 - (long)dst,local_190,0x80000,1,0);
          cVar15 = sVar8 < 0xffffffffffffff89;
          ppVar19 = ppVar18;
          if ((bool)cVar15) {
            dst = (void *)((long)dst + sVar8);
            if (pvVar13 <= dst) {
              __assert_fail("op < oend",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x87cf,"void ZSTDMT_compressionJob(void *)");
            }
            local_190 = (void *)((long)local_190 + 0x80000);
            pthread_mutex_lock(ppVar18);
            *(long *)((long)jobDescription + 8) = *(long *)((long)jobDescription + 8) + sVar8;
            *(long *)jobDescription = lVar11;
            pthread_cond_signal(__cond);
          }
          else {
            pthread_mutex_lock(ppVar18);
            *(size_t *)((long)jobDescription + 8) = sVar8;
          }
          pthread_mutex_unlock(ppVar18);
          if (0xffffffffffffff88 < sVar8) {
            local_190 = (void *)0x0;
            goto LAB_001c0d15;
          }
          lVar11 = lVar11 + 0x80000;
          lVar14 = lVar14 + -1;
          ppVar18 = ppVar19;
        } while (lVar14 != 0);
      }
      cVar15 = '\x01';
      if (iVar5 < 1 && (int)*(long *)((long)jobDescription + 0xc0) == 0) {
        local_190 = (void *)0x0;
      }
      else {
        uVar9 = *(ulong *)((long)jobDescription + 0xb0);
        uVar10 = (ulong)((uint)uVar9 & 0x7ffff);
        uVar12 = uVar10;
        if ((uVar9 & 0x7ffff) == 0) {
          uVar12 = 0x80000;
        }
        if (uVar9 < 0x80000) {
          uVar12 = uVar10;
        }
        if ((int)*(long *)((long)jobDescription + 0xc0) == 0) {
          local_190 = (void *)ZSTD_compressContinue_internal
                                        (cctx,dst,(long)pvVar13 - (long)dst,local_190,uVar12,1,0);
        }
        else {
          local_190 = (void *)ZSTD_compressEnd_public
                                        (cctx,dst,(long)pvVar13 - (long)dst,local_190,uVar12);
        }
        if (0xffffffffffffff88 < local_190) {
          pthread_mutex_lock((pthread_mutex_t *)((long)jobDescription + 0x10));
          *(void **)((long)jobDescription + 8) = local_190;
          pthread_mutex_unlock((pthread_mutex_t *)((long)jobDescription + 0x10));
          cVar15 = '\0';
          local_190 = (void *)0x0;
        }
      }
LAB_001c0d15:
      if (((cVar15 != '\0') && (*(int *)((long)jobDescription + 0xbc) == 0)) &&
         ((cctx->blockState).matchState.window.lowLimit <
          (cctx->blockState).matchState.window.dictLimit)) {
        __assert_fail("!ZSTD_window_hasExtDict(cctx->blockState.matchState.window)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x87e9,"void ZSTDMT_compressionJob(void *)");
      }
      goto LAB_001c0923;
    }
    sVar8 = ZSTD_compressContinue_internal
                      (cctx,dst,(size_t)local_190,*(void **)((long)jobDescription + 0xa8),0,1,0);
    if (sVar8 < 0xffffffffffffff89) {
      ZSTD_invalidateRepCodes(cctx);
      goto LAB_001c0b1c;
    }
    pthread_mutex_lock((pthread_mutex_t *)((long)jobDescription + 0x10));
    *(size_t *)((long)jobDescription + 8) = sVar8;
    pthread_mutex_unlock((pthread_mutex_t *)((long)jobDescription + 0x10));
  }
  local_190 = (void *)0x0;
LAB_001c0923:
  uVar9 = *(ulong *)((long)jobDescription + 8);
  ppVar18 = *(pthread_mutex_t **)((long)jobDescription + 0x80);
  uVar1 = *(uint *)((long)jobDescription + 0xb8);
  pthread_mutex_lock(ppVar18);
  if (*(uint *)((long)ppVar18 + 0x9c0) <= uVar1) {
    if (uVar9 < 0xffffffffffffff89) {
      __assert_fail("ZSTD_isError(cSize)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8750,
                    "void ZSTDMT_serialState_ensureFinished(serialState_t *, unsigned int, size_t)")
      ;
    }
    *(uint *)((long)ppVar18 + 0x9c0) = uVar1 + 1;
    pthread_cond_broadcast((pthread_cond_t *)(ppVar18 + 1));
    pthread_mutex_lock((pthread_mutex_t *)((long)ppVar18 + 0x9c8));
    iVar5 = *(int *)((long)ppVar18 + 0xa20) - ppVar18[0x41].__data.__lock;
    *(int *)((long)ppVar18 + 0xa3c) = iVar5;
    *(int *)((long)ppVar18 + 0xa38) = iVar5;
    pthread_cond_signal((pthread_cond_t *)((long)ppVar18 + 0x9f0));
    pthread_mutex_unlock((pthread_mutex_t *)((long)ppVar18 + 0x9c8));
  }
  pthread_mutex_unlock(ppVar18);
  buf.capacity = local_160 * 0xc;
  buf.start = prVar6;
  ZSTDMT_releaseBuffer(*(ZSTDMT_bufferPool **)((long)jobDescription + 0x78),buf);
  if (cctx != (ZSTD_CCtx *)0x0) {
    ppVar18 = *(pthread_mutex_t **)((long)jobDescription + 0x68);
    pthread_mutex_lock(ppVar18);
    iVar5 = *(int *)((long)ppVar18 + 0x2c);
    if (iVar5 < ppVar18[1].__data.__lock) {
      *(int *)((long)ppVar18 + 0x2c) = iVar5 + 1;
      *(ZSTD_CCtx **)((long)ppVar18 + (long)iVar5 * 8 + 0x48) = cctx;
    }
    else {
      ZSTD_freeCCtx(cctx);
    }
    pthread_mutex_unlock(ppVar18);
  }
  pthread_mutex_lock((pthread_mutex_t *)((long)jobDescription + 0x10));
  if (local_190 == (void *)0x0 || *(ulong *)((long)jobDescription + 8) < 0xffffffffffffff89) {
    *(ulong *)((long)jobDescription + 8) = *(ulong *)((long)jobDescription + 8) + (long)local_190;
    *(long *)jobDescription = *(long *)((long)jobDescription + 0xb0);
    pthread_cond_signal((pthread_cond_t *)((long)jobDescription + 0x38));
    pthread_mutex_unlock((pthread_mutex_t *)((long)jobDescription + 0x10));
    return;
  }
  __assert_fail("lastCBlockSize == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x87f7,"void ZSTDMT_compressionJob(void *)");
}

Assistant:

static void ZSTDMT_compressionJob(void* jobDescription)
{
    ZSTDMT_jobDescription* const job = (ZSTDMT_jobDescription*)jobDescription;
    ZSTD_CCtx_params jobParams = job->params;   /* do not modify job->params ! copy it, modify the copy */
    ZSTD_CCtx* const cctx = ZSTDMT_getCCtx(job->cctxPool);
    rawSeqStore_t rawSeqStore = ZSTDMT_getSeq(job->seqPool);
    buffer_t dstBuff = job->dstBuff;
    size_t lastCBlockSize = 0;

    /* resources */
    if (cctx==NULL) JOB_ERROR(ERROR(memory_allocation));
    if (dstBuff.start == NULL) {   /* streaming job : doesn't provide a dstBuffer */
        dstBuff = ZSTDMT_getBuffer(job->bufPool);
        if (dstBuff.start==NULL) JOB_ERROR(ERROR(memory_allocation));
        job->dstBuff = dstBuff;   /* this value can be read in ZSTDMT_flush, when it copies the whole job */
    }
    if (jobParams.ldmParams.enableLdm == ZSTD_ps_enable && rawSeqStore.seq == NULL)
        JOB_ERROR(ERROR(memory_allocation));

    /* Don't compute the checksum for chunks, since we compute it externally,
     * but write it in the header.
     */
    if (job->jobID != 0) jobParams.fParams.checksumFlag = 0;
    /* Don't run LDM for the chunks, since we handle it externally */
    jobParams.ldmParams.enableLdm = ZSTD_ps_disable;
    /* Correct nbWorkers to 0. */
    jobParams.nbWorkers = 0;


    /* init */
    if (job->cdict) {
        size_t const initError = ZSTD_compressBegin_advanced_internal(cctx, NULL, 0, ZSTD_dct_auto, ZSTD_dtlm_fast, job->cdict, &jobParams, job->fullFrameSize);
        assert(job->firstJob);  /* only allowed for first job */
        if (ZSTD_isError(initError)) JOB_ERROR(initError);
    } else {  /* srcStart points at reloaded section */
        U64 const pledgedSrcSize = job->firstJob ? job->fullFrameSize : job->src.size;
        {   size_t const forceWindowError = ZSTD_CCtxParams_setParameter(&jobParams, ZSTD_c_forceMaxWindow, !job->firstJob);
            if (ZSTD_isError(forceWindowError)) JOB_ERROR(forceWindowError);
        }
        if (!job->firstJob) {
            size_t const err = ZSTD_CCtxParams_setParameter(&jobParams, ZSTD_c_deterministicRefPrefix, 0);
            if (ZSTD_isError(err)) JOB_ERROR(err);
        }
        {   size_t const initError = ZSTD_compressBegin_advanced_internal(cctx,
                                        job->prefix.start, job->prefix.size, ZSTD_dct_rawContent, /* load dictionary in "content-only" mode (no header analysis) */
                                        ZSTD_dtlm_fast,
                                        NULL, /*cdict*/
                                        &jobParams, pledgedSrcSize);
            if (ZSTD_isError(initError)) JOB_ERROR(initError);
    }   }

    /* Perform serial step as early as possible, but after CCtx initialization */
    ZSTDMT_serialState_update(job->serial, cctx, rawSeqStore, job->src, job->jobID);

    if (!job->firstJob) {  /* flush and overwrite frame header when it's not first job */
        size_t const hSize = ZSTD_compressContinue_public(cctx, dstBuff.start, dstBuff.capacity, job->src.start, 0);
        if (ZSTD_isError(hSize)) JOB_ERROR(hSize);
        DEBUGLOG(5, "ZSTDMT_compressionJob: flush and overwrite %u bytes of frame header (not first job)", (U32)hSize);
        ZSTD_invalidateRepCodes(cctx);
    }

    /* compress */
    {   size_t const chunkSize = 4*ZSTD_BLOCKSIZE_MAX;
        int const nbChunks = (int)((job->src.size + (chunkSize-1)) / chunkSize);
        const BYTE* ip = (const BYTE*) job->src.start;
        BYTE* const ostart = (BYTE*)dstBuff.start;
        BYTE* op = ostart;
        BYTE* oend = op + dstBuff.capacity;
        int chunkNb;
        if (sizeof(size_t) > sizeof(int)) assert(job->src.size < ((size_t)INT_MAX) * chunkSize);   /* check overflow */
        DEBUGLOG(5, "ZSTDMT_compressionJob: compress %u bytes in %i blocks", (U32)job->src.size, nbChunks);
        assert(job->cSize == 0);
        for (chunkNb = 1; chunkNb < nbChunks; chunkNb++) {
            size_t const cSize = ZSTD_compressContinue_public(cctx, op, oend-op, ip, chunkSize);
            if (ZSTD_isError(cSize)) JOB_ERROR(cSize);
            ip += chunkSize;
            op += cSize; assert(op < oend);
            /* stats */
            ZSTD_PTHREAD_MUTEX_LOCK(&job->job_mutex);
            job->cSize += cSize;
            job->consumed = chunkSize * chunkNb;
            DEBUGLOG(5, "ZSTDMT_compressionJob: compress new block : cSize==%u bytes (total: %u)",
                        (U32)cSize, (U32)job->cSize);
            ZSTD_pthread_cond_signal(&job->job_cond);   /* warns some more data is ready to be flushed */
            ZSTD_pthread_mutex_unlock(&job->job_mutex);
        }
        /* last block */
        assert(chunkSize > 0);
        assert((chunkSize & (chunkSize - 1)) == 0);  /* chunkSize must be power of 2 for mask==(chunkSize-1) to work */
        if ((nbChunks > 0) | job->lastJob /*must output a "last block" flag*/ ) {
            size_t const lastBlockSize1 = job->src.size & (chunkSize-1);
            size_t const lastBlockSize = ((lastBlockSize1==0) & (job->src.size>=chunkSize)) ? chunkSize : lastBlockSize1;
            size_t const cSize = (job->lastJob) ?
                 ZSTD_compressEnd_public(cctx, op, oend-op, ip, lastBlockSize) :
                 ZSTD_compressContinue_public(cctx, op, oend-op, ip, lastBlockSize);
            if (ZSTD_isError(cSize)) JOB_ERROR(cSize);
            lastCBlockSize = cSize;
    }   }
    if (!job->firstJob) {
        /* Double check that we don't have an ext-dict, because then our
         * repcode invalidation doesn't work.
         */
        assert(!ZSTD_window_hasExtDict(cctx->blockState.matchState.window));
    }
    ZSTD_CCtx_trace(cctx, 0);

_endJob:
    ZSTDMT_serialState_ensureFinished(job->serial, job->jobID, job->cSize);
    if (job->prefix.size > 0)
        DEBUGLOG(5, "Finished with prefix: %zx", (size_t)job->prefix.start);
    DEBUGLOG(5, "Finished with source: %zx", (size_t)job->src.start);
    /* release resources */
    ZSTDMT_releaseSeq(job->seqPool, rawSeqStore);
    ZSTDMT_releaseCCtx(job->cctxPool, cctx);
    /* report */
    ZSTD_PTHREAD_MUTEX_LOCK(&job->job_mutex);
    if (ZSTD_isError(job->cSize)) assert(lastCBlockSize == 0);
    job->cSize += lastCBlockSize;
    job->consumed = job->src.size;  /* when job->consumed == job->src.size , compression job is presumed completed */
    ZSTD_pthread_cond_signal(&job->job_cond);
    ZSTD_pthread_mutex_unlock(&job->job_mutex);
}